

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

int16 get16bits11signed(int base,int table,int mul,int index)

{
  int iVar1;
  int16 sixteenbits;
  int16 fifteenbits;
  int elevenbits;
  int elevenTabVal;
  int sign;
  int tabVal;
  int elevenbase;
  int index_local;
  int mul_local;
  int table_local;
  int base_local;
  
  elevenbase = base + -0x80;
  if (elevenbase == -0x80) {
    elevenbase = -0x7f;
  }
  tabVal = -alphaBase[table][3 - index % 4] + -1;
  if (index / 4 != 1) {
    tabVal = -alphaBase[table][3 - index % 4];
  }
  if (mul == 0) {
    elevenTabVal = (tabVal * 8) / 8;
  }
  else {
    elevenTabVal = mul * tabVal * 8;
  }
  if (index / 4 != 1) {
    elevenTabVal = -elevenTabVal;
  }
  elevenbits = elevenbase * 8 + elevenTabVal;
  if (elevenbits < 0x400) {
    if (elevenbits < -0x3ff) {
      elevenbits = -0x3ff;
    }
  }
  else {
    elevenbits = 0x3ff;
  }
  iVar1 = elevenbits;
  if (elevenbits < 1) {
    iVar1 = -elevenbits;
  }
  sixteenbits = (short)(iVar1 << 5) + (short)(iVar1 >> 5);
  if (elevenbits < 0) {
    sixteenbits = -sixteenbits;
  }
  return sixteenbits;
}

Assistant:

int16 get16bits11signed(int base, int table, int mul, int index) 
{
	int elevenbase = base-128;
	if(elevenbase==-128)
		elevenbase=-127;
	elevenbase*=8;
	//i want the positive value here
	int tabVal = -alphaBase[table][3-index%4]-1;
	//and the sign, please
	int sign = 1-(index/4);
	
	if(sign)
		tabVal=tabVal+1;
	int elevenTabVal = tabVal*8;

	if(mul!=0)
		elevenTabVal*=mul;
	else
		elevenTabVal/=8;

	if(sign)
		elevenTabVal=-elevenTabVal;

	//calculate sum
	int elevenbits = elevenbase+elevenTabVal;

	//clamp..
	if(elevenbits>=1024)
		elevenbits=1023;
	else if(elevenbits<-1023)
		elevenbits=-1023;
	//this is the value we would actually output.. 
	//but there aren't any good 11-bit file or uncompressed GL formats
	//so we extend to 15 bits signed.
	sign = elevenbits<0;
	elevenbits=abs(elevenbits);
	int16 fifteenbits = (elevenbits<<5)+(elevenbits>>5);
	int16 sixteenbits=fifteenbits;

	if(sign)
		sixteenbits=-sixteenbits;
	
	return sixteenbits;
}